

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tld-tree.c
# Opt level: O2

void faup_tld_tree_add_tld(char *tld,void *user_data)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  
  sVar3 = strlen(tld);
  if (*tld == '!') {
    pcVar4 = *(char **)((long)user_data + 8);
    if (pcVar4 != (char *)0x0) goto LAB_00117f88;
    pcVar4 = (char *)calloc(1,0x18);
    *(char **)((long)user_data + 8) = pcVar4;
  }
  else {
    pcVar4 = *(char **)((long)user_data + 0x10);
    if (pcVar4 != (char *)0x0) goto LAB_00117f88;
    pcVar4 = (char *)calloc(1,0x18);
    *(char **)((long)user_data + 0x10) = pcVar4;
  }
  if (pcVar4 == (char *)0x0) {
LAB_0011805f:
    fprintf(_stderr,"Error adding the tld \'%s\' to the tree\n",tld);
    return;
  }
  *pcVar4 = '\0';
LAB_00117f88:
  iVar2 = (int)sVar3;
  pcVar9 = tld + iVar2;
  iVar8 = 0;
  iVar6 = 0;
  if (0 < iVar2) {
    iVar6 = iVar2;
  }
LAB_00117f9e:
  if (iVar8 == iVar6) {
    return;
  }
  iVar8 = iVar8 + 1;
  if (iVar8 < iVar2) {
    bVar10 = pcVar9[-2] == '.';
    bVar11 = pcVar9[-2] == '!';
  }
  else {
    bVar10 = false;
    bVar11 = false;
  }
  pcVar9 = pcVar9 + -1;
  cVar1 = *pcVar9;
  pcVar5 = *(char **)(pcVar4 + 0x10);
  if (*(char **)(pcVar4 + 0x10) != (char *)0x0) goto LAB_00117fd7;
  pcVar5 = (char *)calloc(1,0x18);
  *(char **)(pcVar4 + 0x10) = pcVar5;
LAB_00118028:
  if (pcVar5 != (char *)0x0) {
    *pcVar5 = cVar1;
    uVar7 = (uint)(byte)(bVar10 | bVar11 | iVar8 == iVar2);
    pcVar4 = pcVar5;
    goto LAB_00118047;
  }
  goto LAB_0011805f;
LAB_00117fd7:
  do {
    pcVar4 = pcVar5;
    if (*(char **)(pcVar4 + 8) == (char *)0x0) {
      if (*pcVar4 != cVar1) {
        pcVar5 = (char *)calloc(1,0x18);
        *(char **)(pcVar4 + 8) = pcVar5;
        goto LAB_00118028;
      }
      break;
    }
    pcVar5 = *(char **)(pcVar4 + 8);
  } while (*pcVar4 != cVar1);
  uVar7 = 1;
  if ((bVar10 != false || bVar11 != false) || iVar8 == iVar2) {
LAB_00118047:
    *(uint *)(pcVar4 + 4) = uVar7;
  }
  goto LAB_00117f9e;
}

Assistant:

static void faup_tld_tree_add_tld(char *tld, void *user_data)
{
	int retval;

	TLDNode *Tree = (TLDNode *)user_data;

	retval = faup_tld_tree_add_node(&Tree, tld, strlen(tld));
	if (retval) {
		fprintf(stderr, "Error adding the tld '%s' to the tree\n", tld);
	}

}